

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void opj_dwt_decode_v_func(void *user_data,opj_tls_t *tls)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = *(uint *)((long)user_data + 0x28);
  uVar2 = *(uint *)((long)user_data + 0x2c);
  uVar3 = uVar1;
  if (uVar1 + 8 <= uVar2) {
    do {
      opj_idwt53_v((opj_dwt_t *)user_data,
                   (OPJ_INT32 *)((ulong)uVar3 * 4 + *(long *)((long)user_data + 0x20)),
                   (ulong)*(uint *)((long)user_data + 0x1c),8);
      uVar2 = *(uint *)((long)user_data + 0x2c);
      uVar1 = uVar3 + 8;
      uVar4 = uVar3 + 0x10;
      uVar3 = uVar1;
    } while (uVar4 <= uVar2);
  }
  if (uVar1 <= uVar2 && uVar2 - uVar1 != 0) {
    opj_idwt53_v((opj_dwt_t *)user_data,
                 (OPJ_INT32 *)((ulong)uVar1 * 4 + *(long *)((long)user_data + 0x20)),
                 (ulong)*(uint *)((long)user_data + 0x1c),uVar2 - uVar1);
  }
  opj_aligned_free(*user_data);
  opj_free(user_data);
  return;
}

Assistant:

static void opj_dwt_decode_v_func(void* user_data, opj_tls_t* tls)
{
    OPJ_UINT32 j;
    opj_dwd_decode_v_job_t* job;
    (void)tls;

    job = (opj_dwd_decode_v_job_t*)user_data;
    for (j = job->min_j; j + PARALLEL_COLS_53 <= job->max_j;
            j += PARALLEL_COLS_53) {
        opj_idwt53_v(&job->v, &job->tiledp[j], (OPJ_SIZE_T)job->w,
                     PARALLEL_COLS_53);
    }
    if (j < job->max_j)
        opj_idwt53_v(&job->v, &job->tiledp[j], (OPJ_SIZE_T)job->w,
                     (OPJ_INT32)(job->max_j - j));

    opj_aligned_free(job->v.mem);
    opj_free(job);
}